

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

int luaH_next(lua_State *L,Table *t,StkId key)

{
  Node *pNVar1;
  byte bVar2;
  uint uVar3;
  Node *n_;
  TValue *pTVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  TValue *io;
  long lVar10;
  
  uVar3 = t->asize;
  if (((key->val).tt_ & 0xf) == 0) {
    uVar5 = 0;
  }
  else if (((key->val).tt_ != 3) ||
          (uVar5 = *(ulong *)key, (int)uVar5 == 0 || (ulong)uVar3 <= uVar5 - 1)) {
    pTVar4 = getgeneric(t,&key->val,1);
    if (pTVar4->tt_ == ' ') {
      luaG_runerror(L,"invalid key to \'next\'");
    }
    uVar5 = (ulong)(uVar3 + (int)((ulong)((long)pTVar4 - (long)t->node) >> 3) * -0x55555555 + 1);
  }
  uVar7 = (uint)uVar5;
  uVar8 = uVar7;
  if (uVar7 < uVar3) {
    uVar5 = uVar5 & 0xffffffff;
    lVar9 = uVar5 << 0x20;
    uVar6 = ~uVar5;
    lVar10 = 0;
    do {
      lVar9 = lVar9 + 0x100000000;
      bVar2 = *(byte *)((long)t->array + lVar10 + uVar5 + 4);
      if ((bVar2 & 0xf) != 0) {
        (key->val).value_.i = lVar9 >> 0x20;
        (key->val).tt_ = '\x03';
        *(byte *)((long)key + 0x18) = bVar2;
        key[1].val.value_ = t->array[uVar6];
        return 1;
      }
      uVar6 = uVar6 - 1;
      lVar10 = lVar10 + 1;
      uVar8 = uVar3;
    } while (uVar3 - uVar7 != (int)lVar10);
  }
  uVar8 = uVar8 - uVar3;
  if (uVar8 >> (t->lsizenode & 0x1f) == 0) {
    do {
      if ((*(byte *)((long)t->node + (ulong)uVar8 * 0x18 + 8) & 0xf) != 0) {
        pNVar1 = t->node + uVar8;
        (key->val).value_ = (pNVar1->u).key_val;
        (key->val).tt_ = (pNVar1->u).key_tt;
        key[1].val.value_ = (pNVar1->u).value_;
        *(lu_byte *)((long)key + 0x18) = (pNVar1->u).tt_;
        return 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 >> (t->lsizenode & 0x1f) == 0);
  }
  return 0;
}

Assistant:

int luaH_next (lua_State *L, Table *t, StkId key) {
  unsigned int asize = t->asize;
  unsigned int i = findindex(L, t, s2v(key), asize);  /* find original key */
  for (; i < asize; i++) {  /* try first array part */
    lu_byte tag = *getArrTag(t, i);
    if (!tagisempty(tag)) {  /* a non-empty entry? */
      setivalue(s2v(key), cast_int(i) + 1);
      farr2val(t, i, tag, s2v(key + 1));
      return 1;
    }
  }
  for (i -= asize; i < sizenode(t); i++) {  /* hash part */
    if (!isempty(gval(gnode(t, i)))) {  /* a non-empty entry? */
      Node *n = gnode(t, i);
      getnodekey(L, s2v(key), n);
      setobj2s(L, key + 1, gval(n));
      return 1;
    }
  }
  return 0;  /* no more elements */
}